

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

void __thiscall QtPrivate::QColorShower::setHsv(QColorShower *this,int h,int s,int v)

{
  QLineEdit *this_00;
  QRgb QVar1;
  long in_FS_OFFSET;
  QString local_50;
  undefined4 local_38;
  undefined2 uStack_34;
  undefined2 uStack_32;
  undefined6 uStack_30;
  undefined2 uStack_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)(v | s) < 0x100 && -2 < h) {
    this->rgbOriginal = false;
    this->hue = h;
    this->val = v;
    this->sat = s;
    uStack_2a = 0xaaaa;
    local_38 = 0;
    uStack_34 = 0xffff;
    uStack_32 = 0;
    uStack_30 = 0;
    QColor::setHsv((int)&local_38,h,s,v);
    QVar1 = QColor::rgb();
    this->curCol = QVar1;
    QColSpinBox::setValue(this->hEd,this->hue);
    QColSpinBox::setValue(this->sEd,this->sat);
    QColSpinBox::setValue(this->vEd,this->val);
    QColSpinBox::setValue(this->rEd,(uint)*(byte *)((long)&this->curCol + 2));
    QColSpinBox::setValue(this->gEd,(uint)*(byte *)((long)&this->curCol + 1));
    QColSpinBox::setValue(this->bEd,(uint)(byte)this->curCol);
    this_00 = this->htEd;
    QColor::name((NameFormat)&local_50);
    QLineEdit::setText(this_00,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    showCurrentColor(this);
    updateQColor(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorShower::setHsv(int h, int s, int v)
{
    if (h < -1 || (uint)s > 255 || (uint)v > 255)
        return;

    rgbOriginal = false;
    hue = h; val = v; sat = s;
    QColor c;
    c.setHsv(hue, sat, val);
    curCol = c.rgb();

    hEd->setValue(hue);
    sEd->setValue(sat);
    vEd->setValue(val);

    rEd->setValue(qRed(currentColor()));
    gEd->setValue(qGreen(currentColor()));
    bEd->setValue(qBlue(currentColor()));

    htEd->setText(c.name());

    showCurrentColor();
    updateQColor();
}